

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  ulong n_00;
  sqlite3 *db;
  char *zName;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar8;
  short sVar9;
  ulong uVar10;
  VList *pIn;
  bool bVar11;
  ulong local_38;
  u32 uVar7;
  
  if (pExpr == (Expr *)0x0) {
    return;
  }
  db = pParse->db;
  zName = (pExpr->u).zToken;
  if ((long)zName[1] == 0) {
    uVar1 = *(int *)&pParse->nVar + 1;
    local_38 = (ulong)uVar1;
    pParse->nVar = (ynVar)uVar1;
    goto LAB_001797cf;
  }
  if (*zName == '?') {
    if (n == 2) {
      local_38 = (long)zName[1] - 0x30;
      bVar11 = false;
    }
    else {
      iVar5 = sqlite3Atoi64(zName + 1,(i64 *)&local_38,n - 1,'\x01');
      bVar11 = iVar5 != 0;
    }
    if (((bVar11) || ((long)local_38 < 1)) || ((long)db->aLimit[9] < (long)local_38)) {
      sqlite3ErrorMsg(pParse,"variable number must be between ?1 and ?%d");
      return;
    }
    sVar9 = (short)local_38;
    uVar10 = local_38;
    if (pParse->nVar < sVar9) {
      pParse->nVar = sVar9;
      pIn = pParse->pVList;
    }
    else {
      pIn = pParse->pVList;
      if (pIn == (int *)0x0) {
        pIn = (int *)0x0;
      }
      else {
        iVar5 = 2;
        do {
          piVar4 = pIn + iVar5;
          if (*piVar4 == (int)sVar9) {
            if (piVar4 != (int *)0xfffffffffffffff8) goto LAB_001797cf;
            break;
          }
          iVar5 = iVar5 + piVar4[1];
        } while (iVar5 < pIn[1]);
      }
    }
  }
  else {
    pIn = pParse->pVList;
    uVar1 = sqlite3VListNameToNum(pIn,zName,n);
    local_38 = (ulong)uVar1;
    if ((short)uVar1 != 0) goto LAB_001797cf;
    uVar1 = *(int *)&pParse->nVar + 1;
    pParse->nVar = (ynVar)uVar1;
    uVar10 = (ulong)uVar1;
  }
  uVar7 = n + 3;
  if (-1 < (int)n) {
    uVar7 = n;
  }
  iVar6 = (int)uVar7 >> 2;
  iVar5 = iVar6 + 3;
  if (pIn == (int *)0x0) {
    piVar4 = (int *)sqlite3DbMallocRawNN(db,(long)iVar6 * 4 + 0x34);
    if (piVar4 != (int *)0x0) {
      uVar8 = (ulong)(iVar6 + 0xd);
      piVar4[1] = 2;
      iVar6 = 2;
      goto LAB_0017978a;
    }
    pIn = (int *)0x0;
  }
  else {
    iVar6 = pIn[1];
    iVar2 = iVar6 + iVar5;
    if (*pIn < iVar2) {
      uVar8 = (long)iVar5 + (long)*pIn * 2;
      n_00 = uVar8 * 4;
      if (((pIn < (db->lookaside).pStart) || ((db->lookaside).pEnd <= pIn)) ||
         (uVar3 = (ulong)(db->lookaside).sz, piVar4 = pIn, uVar3 <= n_00 && n_00 - uVar3 != 0)) {
        piVar4 = (int *)dbReallocFinish(db,pIn,n_00);
        if (piVar4 == (int *)0x0) goto LAB_001797c3;
        iVar6 = piVar4[1];
      }
LAB_0017978a:
      *piVar4 = (int)uVar8;
      iVar2 = iVar6 + iVar5;
      pIn = piVar4;
    }
    piVar4 = pIn + iVar6;
    *piVar4 = (int)(short)uVar10;
    piVar4[1] = iVar5;
    pIn[1] = iVar2;
    memcpy(piVar4 + 2,zName,(long)(int)n);
    *(undefined1 *)((long)pIn + (long)(int)n + 8U + (long)iVar6 * 4) = 0;
  }
LAB_001797c3:
  pParse->pVList = pIn;
  local_38 = uVar10;
LAB_001797cf:
  pExpr->iColumn = (short)local_38;
  if ((int)(short)local_38 <= db->aLimit[9]) {
    return;
  }
  sqlite3ErrorMsg(pParse,"too many SQL variables");
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
  }
}